

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::Pop(Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  PositionType position;
  iterator it;
  iterator it_00;
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  size_type sVar4;
  PointerType pSVar5;
  undefined1 local_30 [8];
  PositionType prevPos;
  PositionType pos;
  cmState *this_local;
  
  prevPos.Position = (PositionType)originSnapshot.Position.Tree;
  local_30 = (undefined1  [8])originSnapshot.Position.Tree;
  prevPos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)originSnapshot.Position.Position;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::operator++((iterator *)local_30);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&pBVar3->IncludeDirectories);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar2->IncludeDirectoryPosition = sVar4;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&pBVar3->CompileDefinitions);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar2->CompileDefinitionsPosition = sVar4;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&pBVar3->CompileOptions);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pSVar2->CompileOptionsPosition = sVar4;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_30;
  (pBVar3->DirectoryEnd).Position = (PositionType)prevPos.Tree;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                     ((iterator *)&prevPos.Position);
  if (((pSVar2->Keep & 1U) == 0) &&
     (it_00.Position = originSnapshot.Position.Position,
     it_00.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)prevPos.Position,
     bVar1 = cmLinkedTree<cmState::SnapshotDataType>::IsLast(&this->SnapshotData,it_00), bVar1)) {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                       ((iterator *)&prevPos.Position);
    pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
    bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&pSVar2->Vars,pSVar5->Vars);
    if (bVar1) {
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      bVar1 = cmLinkedTree<cmDefinitions>::IsLast(&this->VarTree,pSVar2->Vars);
      if (!bVar1) {
        __assert_fail("this->VarTree.IsLast(pos->Vars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                      ,0x400,"cmState::Snapshot cmState::Pop(cmState::Snapshot)");
      }
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      cmLinkedTree<cmDefinitions>::Pop(&this->VarTree,pSVar2->Vars);
    }
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                       ((iterator *)&prevPos.Position);
    pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
    bVar1 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::iterator::operator!=(&pSVar2->ExecutionListFile,pSVar5->ExecutionListFile);
    if (bVar1) {
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      bVar1 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::IsLast(&this->ExecutionListFiles,pSVar2->ExecutionListFile);
      if (!bVar1) {
        __assert_fail("this->ExecutionListFiles.IsLast(pos->ExecutionListFile)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                      ,0x405,"cmState::Snapshot cmState::Pop(cmState::Snapshot)");
      }
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Pop(&this->ExecutionListFiles,pSVar2->ExecutionListFile);
    }
    it.Position = originSnapshot.Position.Position;
    it.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)prevPos.Position;
    cmLinkedTree<cmState::SnapshotDataType>::Pop(&this->SnapshotData,it);
  }
  position.Position = (PositionType)prevPos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_30;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Pop(cmState::Snapshot originSnapshot)
{
  PositionType pos = originSnapshot.Position;
  PositionType prevPos = pos;
  ++prevPos;
  prevPos->IncludeDirectoryPosition =
      prevPos->BuildSystemDirectory->IncludeDirectories.size();
  prevPos->CompileDefinitionsPosition =
      prevPos->BuildSystemDirectory->CompileDefinitions.size();
  prevPos->CompileOptionsPosition =
      prevPos->BuildSystemDirectory->CompileOptions.size();
  prevPos->BuildSystemDirectory->DirectoryEnd = prevPos;

  if (!pos->Keep && this->SnapshotData.IsLast(pos))
    {
    if (pos->Vars != prevPos->Vars)
      {
      assert(this->VarTree.IsLast(pos->Vars));
      this->VarTree.Pop(pos->Vars);
      }
    if (pos->ExecutionListFile != prevPos->ExecutionListFile)
      {
      assert(this->ExecutionListFiles.IsLast(pos->ExecutionListFile));
      this->ExecutionListFiles.Pop(pos->ExecutionListFile);
      }
    this->SnapshotData.Pop(pos);
    }

  return Snapshot(this, prevPos);
}